

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.hpp
# Opt level: O0

void __thiscall duckdb::RegexLocalState::~RegexLocalState(RegexLocalState *this)

{
  FunctionLocalState *in_RDI;
  RE2 *in_stack_00000060;
  
  in_RDI->_vptr_FunctionLocalState = (_func_int **)&PTR__RegexLocalState_0351cc58;
  RegexStringPieceArgs::~RegexStringPieceArgs((RegexStringPieceArgs *)0x13c57dd);
  duckdb_re2::RE2::~RE2(in_stack_00000060);
  FunctionLocalState::~FunctionLocalState(in_RDI);
  return;
}

Assistant:

explicit RegexLocalState(RegexpBaseBindData &info, bool extract_all = false)
	    : constant_pattern(duckdb_re2::StringPiece(info.constant_string.c_str(), info.constant_string.size()),
	                       info.options) {
		if (!constant_pattern.ok()) {
			throw InvalidInputException(constant_pattern.error());
		}
		if (extract_all) {
			auto group_count_p = constant_pattern.NumberOfCapturingGroups();
			if (group_count_p != -1) {
				group_buffer.Init(NumericCast<idx_t>(group_count_p));
			}
		}
		D_ASSERT(info.constant_pattern);
	}